

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O1

void test_open_address_dictionary_cursor_equality(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  ion_dict_cursor_t *cursor;
  ion_record_info_t record;
  ion_dictionary_t test_dictionary;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  ion_dict_cursor_t *local_b8;
  undefined4 local_ac;
  ion_record_info_t local_a8;
  ion_dictionary_t local_a0;
  ion_predicate_t local_88;
  ion_dictionary_handler_t local_68;
  
  local_a8.key_size = 4;
  local_a8.value_size = 10;
  createTestDictionary(&local_68,&local_a8,10,&local_a0,key_type_numeric_signed);
  local_ac = 1;
  dictionary_build_predicate(&local_88,'\0');
  iVar1 = dictionary_find(&local_a0,&local_88,&local_b8);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0xa5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(local_b8->status == '\x02'),0xa8,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      (*local_b8->destroy)(&local_b8);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(local_b8 == (ion_dict_cursor_t *)0x0),0xae,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        dictionary_delete_dictionary(&local_a0);
        return;
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_cursor_equality(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record;

	/* this is required for initializing the hash map and should come from the dictionary */
	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor pointer */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* destroy the cursor */
	cursor->destroy(&cursor);

	/* and check that cursor has been destroyed correctly */
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL == cursor);

	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}